

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall BuildTestDepFileOK::Run(BuildTestDepFileOK *this)

{
  VirtualFileSystem *this_00;
  int iVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  Edge *this_01;
  Test *pTVar4;
  bool bVar5;
  int iVar6;
  Node *pNVar7;
  string err;
  allocator<char> local_8a;
  allocator<char> local_89;
  string local_88;
  string local_68;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  ppEVar2 = *(pointer *)
             ((long)&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_.edges_.
                     super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                     super__Vector_impl_data + 8);
  ppEVar3 = (this->super_BuildTest).super_StateTestWithBuiltinRules.state_.edges_.
            super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.super__Vector_impl_data.
            _M_start;
  iVar1 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_,
              "rule cc\n  command = cc $in\n  depfile = $out.d\nbuild foo.o: cc foo.c\n",
              (ManifestParserOptions)0x0);
  iVar6 = g_current_test->assertion_failures_;
  if (iVar1 == iVar6) {
    this_01 = (*(pointer *)
                ((long)&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_.edges_.
                        super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                        super__Vector_impl_data + 8))[-1];
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"foo.c",&local_89);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_8a);
    this_00 = &(this->super_BuildTest).fs_;
    VirtualFileSystem::Create(this_00,&local_88,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"bar.h",(allocator<char> *)&local_68);
    pNVar7 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_88);
    pNVar7->dirty_ = true;
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"foo.o.d",&local_89);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"foo.o: blah.h bar.h\n",&local_8a);
    VirtualFileSystem::Create(this_00,&local_88,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    pTVar4 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"foo.o",(allocator<char> *)&local_68);
    pNVar7 = Builder::AddTarget(&(this->super_BuildTest).builder_,&local_88,&local_48);
    testing::Test::Check
              (pTVar4,pNVar7 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x3be,"builder_.AddTarget(\"foo.o\", &err)");
    std::__cxx11::string::~string((string *)&local_88);
    pTVar4 = g_current_test;
    bVar5 = std::operator==("",&local_48);
    bVar5 = testing::Test::Check
                      (pTVar4,bVar5,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0x3bf,"\"\" == err");
    if ((bVar5) &&
       (bVar5 = testing::Test::Check
                          (g_current_test,
                           (long)(this->super_BuildTest).fs_.files_read_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->super_BuildTest).fs_.files_read_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start == 0x20,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                           ,0x3c0,"1u == fs_.files_read_.size()"), pTVar4 = g_current_test, bVar5))
    {
      bVar5 = std::operator==("foo.o.d",
                              (this->super_BuildTest).fs_.files_read_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      testing::Test::Check
                (pTVar4,bVar5,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                 ,0x3c1,"\"foo.o.d\" == fs_.files_read_[0]");
      bVar5 = testing::Test::Check
                        (g_current_test,
                         (int)((ulong)((long)ppEVar2 - (long)ppEVar3) >> 3) + 3 ==
                         (int)((ulong)((long)*(pointer *)
                                              ((long)&(this->super_BuildTest).
                                                      super_StateTestWithBuiltinRules.state_.edges_.
                                                                                                            
                                                  super__Vector_base<Edge_*,_std::allocator<Edge_*>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                      (long)(this->super_BuildTest).super_StateTestWithBuiltinRules.
                                            state_.edges_.
                                            super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                                            _M_impl.super__Vector_impl_data._M_start) >> 3),
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0x3c5,"orig_edges + 3 == (int)state_.edges_.size()");
      if ((bVar5) &&
         (bVar5 = testing::Test::Check
                            (g_current_test,
                             (long)(this_01->inputs_).
                                   super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)(this_01->inputs_).
                                   super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                   super__Vector_impl_data._M_start == 0x18,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                             ,0x3c7,"3u == edge->inputs_.size()"), pTVar4 = g_current_test, bVar5))
      {
        Edge::EvaluateCommand_abi_cxx11_(&local_88,this_01,false);
        bVar5 = std::operator==("cc foo.c",&local_88);
        bVar5 = testing::Test::Check
                          (pTVar4,bVar5,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                           ,0x3ca,"\"cc foo.c\" == edge->EvaluateCommand()");
        std::__cxx11::string::~string((string *)&local_88);
        if (bVar5) goto LAB_00128f78;
      }
    }
    iVar6 = g_current_test->assertion_failures_;
  }
  g_current_test->assertion_failures_ = iVar6 + 1;
LAB_00128f78:
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

TEST_F(BuildTest, DepFileOK) {
  string err;
  int orig_edges = state_.edges_.size();
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule cc\n  command = cc $in\n  depfile = $out.d\n"
"build foo.o: cc foo.c\n"));
  Edge* edge = state_.edges_.back();

  fs_.Create("foo.c", "");
  GetNode("bar.h")->MarkDirty();  // Mark bar.h as missing.
  fs_.Create("foo.o.d", "foo.o: blah.h bar.h\n");
  EXPECT_TRUE(builder_.AddTarget("foo.o", &err));
  ASSERT_EQ("", err);
  ASSERT_EQ(1u, fs_.files_read_.size());
  EXPECT_EQ("foo.o.d", fs_.files_read_[0]);

  // Expect three new edges: one generating foo.o, and two more from
  // loading the depfile.
  ASSERT_EQ(orig_edges + 3, (int)state_.edges_.size());
  // Expect our edge to now have three inputs: foo.c and two headers.
  ASSERT_EQ(3u, edge->inputs_.size());

  // Expect the command line we generate to only use the original input.
  ASSERT_EQ("cc foo.c", edge->EvaluateCommand());
}